

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5IndexTombstoneQuery(Fts5Data *pHash,int nHashTable,u64 iRowid)

{
  long lVar1;
  int iVar2;
  u32 uVar3;
  u64 uVar4;
  ulong in_RDX;
  int in_ESI;
  long *in_RDI;
  u64 *aSlot_1;
  u32 *aSlot;
  int nCollide;
  int iSlot;
  int nSlot;
  int szKey;
  int local_44;
  int local_30;
  int local_2c;
  uint local_4;
  
  iVar2 = 8;
  if (*(char *)*in_RDI == '\x04') {
    iVar2 = 4;
  }
  if ((int)in_RDI[1] < 0x11) {
    local_44 = 1;
  }
  else {
    local_44 = 8;
    if (*(char *)*in_RDI == '\x04') {
      local_44 = 4;
    }
    local_44 = ((int)in_RDI[1] + -8) / local_44;
  }
  local_2c = (int)((in_RDX / (ulong)(long)in_ESI) % (ulong)(long)local_44);
  local_30 = local_44;
  if (in_RDX == 0) {
    local_4 = (uint)*(byte *)(*in_RDI + 1);
  }
  else {
    if (iVar2 == 4) {
      lVar1 = *in_RDI;
      while (*(int *)(lVar1 + 8 + (long)local_2c * 4) != 0) {
        uVar3 = fts5GetU32((u8 *)(lVar1 + 8 + (long)local_2c * 4));
        if (uVar3 == in_RDX) {
          return 1;
        }
        if (local_30 == 0) break;
        local_2c = (local_2c + 1) % local_44;
        local_30 = local_30 + -1;
      }
    }
    else {
      lVar1 = *in_RDI;
      while (*(long *)(lVar1 + 8 + (long)local_2c * 8) != 0) {
        uVar4 = fts5GetU64((u8 *)(lVar1 + 8 + (long)local_2c * 8));
        if (uVar4 == in_RDX) {
          return 1;
        }
        if (local_30 == 0) break;
        local_2c = (local_2c + 1) % local_44;
        local_30 = local_30 + -1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int fts5IndexTombstoneQuery(
  Fts5Data *pHash,                /* Hash table page to query */
  int nHashTable,                 /* Number of pages attached to segment */
  u64 iRowid                      /* Rowid to query hash for */
){
  const int szKey = TOMBSTONE_KEYSIZE(pHash);
  const int nSlot = TOMBSTONE_NSLOT(pHash);
  int iSlot = (iRowid / nHashTable) % nSlot;
  int nCollide = nSlot;

  if( iRowid==0 ){
    return pHash->p[1];
  }else if( szKey==4 ){
    u32 *aSlot = (u32*)&pHash->p[8];
    while( aSlot[iSlot] ){
      if( fts5GetU32((u8*)&aSlot[iSlot])==iRowid ) return 1;
      if( nCollide--==0 ) break;
      iSlot = (iSlot+1)%nSlot;
    }
  }else{
    u64 *aSlot = (u64*)&pHash->p[8];
    while( aSlot[iSlot] ){
      if( fts5GetU64((u8*)&aSlot[iSlot])==iRowid ) return 1;
      if( nCollide--==0 ) break;
      iSlot = (iSlot+1)%nSlot;
    }
  }

  return 0;
}